

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O3

void initedog(monst *mtmp)

{
  byte *pbVar1;
  
  mtmp->mtame = ((mtmp->data->mflags2 >> 0x16 & 1) != 0) * '\x05' + '\x05';
  *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffbf7fff | 0x400000;
  set_malign(mtmp);
  mtmp->field_0x63 = mtmp->field_0x63 & 0xfe;
  *(undefined8 *)&mtmp->meating = 0;
  mtmp[1].nmon = (monst *)0xa00002710;
  *(undefined4 *)&mtmp[1].data = 0;
  *(uint *)((long)&mtmp[1].data + 4) = moves + 1000;
  *(undefined2 *)((long)&mtmp[1].minvent + 4) = 0xffff;
  mtmp[1].dlevel = (level *)0x0;
  *(undefined4 *)&mtmp[1].minvent = 0;
  pbVar1 = (byte *)((long)&mtmp[1].minvent + 6);
  *pbVar1 = *pbVar1 & 0xfe;
  return;
}

Assistant:

void initedog(struct monst *mtmp)
{
	mtmp->mtame = is_domestic(mtmp->data) ? 10 : 5;
	mtmp->mpeaceful = 1;
	mtmp->mavenge = 0;
	set_malign(mtmp); /* recalc alignment now that it's tamed */
	mtmp->mleashed = 0;
	mtmp->meating = 0;
	EDOG(mtmp)->droptime = 0;
	EDOG(mtmp)->dropdist = 10000;
	EDOG(mtmp)->apport = 10;
	EDOG(mtmp)->whistletime = 0;
	EDOG(mtmp)->hungrytime = 1000 + moves;
	EDOG(mtmp)->ogoal.x = -1;	/* force error if used before set */
	EDOG(mtmp)->ogoal.y = -1;
	EDOG(mtmp)->abuse = 0;
	EDOG(mtmp)->revivals = 0;
	EDOG(mtmp)->mhpmax_penalty = 0;
	EDOG(mtmp)->killed_by_u = 0;
}